

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O1

int skipToGenCode(char *dstName,FILE *out,FILE *templateFile)

{
  int iVar1;
  char *pcVar2;
  char *__format;
  
  pcVar2 = fgets(gTempBuf,16000,(FILE *)templateFile);
  __format = "Line with string %%%%%%GENCODE%%%%%% Missing in [%s]";
  do {
    if (pcVar2 == (char *)0x0) {
LAB_00116ae1:
      printf(__format,dstName);
      return -1;
    }
    if (CONCAT53(gTempBuf._8_5_,gTempBuf._5_3_) == 0x25252545444f434e &&
        CONCAT35(gTempBuf._5_3_,gTempBuf._0_5_) == 0x4f434e4547252525) {
      gTempBuf[0] = (char)gTempBuf._0_5_;
      gTempBuf[1] = SUB51(gTempBuf._0_5_,1);
      gTempBuf[2] = SUB51(gTempBuf._0_5_,2);
      gTempBuf[3] = SUB51(gTempBuf._0_5_,3);
      gTempBuf[4] = SUB51(gTempBuf._0_5_,4);
      gTempBuf[5] = (char)gTempBuf._5_3_;
      gTempBuf[6] = SUB31(gTempBuf._5_3_,1);
      gTempBuf[7] = SUB31(gTempBuf._5_3_,2);
      gTempBuf[8] = (char)gTempBuf._8_5_;
      gTempBuf[9] = SUB51(gTempBuf._8_5_,1);
      gTempBuf[10] = SUB51(gTempBuf._8_5_,2);
      gTempBuf[0xb] = SUB51(gTempBuf._8_5_,3);
      gTempBuf[0xc] = SUB51(gTempBuf._8_5_,4);
      return 0;
    }
    if ((out != (FILE *)0x0) && (iVar1 = fputs(gTempBuf,(FILE *)out), iVar1 == -1)) {
      __format = "Cannot write to [%s]\n";
      goto LAB_00116ae1;
    }
    pcVar2 = fgets(gTempBuf,16000,(FILE *)templateFile);
  } while( true );
}

Assistant:

static int skipToGenCode( const char *dstName, FILE *out, FILE *templateFile )
{
   unsigned int headerWritten = 0;

   while( fgets( gTempBuf, BUFFER_SIZE, templateFile ) )
   {
      if( strncmp( gTempBuf, "%%%GENCODE%%%", 13 ) == 0 )
      {
         headerWritten = 1;
         break;
      }
      if( out && (fputs( gTempBuf, out ) == EOF) )
      {
         printf( "Cannot write to [%s]\n", dstName );
         return -1;
      }
   }

   if( !headerWritten )
   {
      printf( "Line with string %%%%%%GENCODE%%%%%% Missing in [%s]", dstName );
      return -1;
   }

   return 0;
}